

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall spoa::Graph::Clear(Graph *this)

{
  int local_3c;
  int *local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  int local_24;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  Graph *local_10;
  Graph *this_local;
  
  this->num_codes_ = 0;
  local_10 = this;
  local_18._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->coder_);
  local_20 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->coder_);
  local_24 = -1;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (local_18,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_20,
             &local_24);
  local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->decoder_);
  local_38 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->decoder_);
  local_3c = -1;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (local_30,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_38,
             &local_3c);
  std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::clear(&this->sequences_);
  std::
  vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  ::clear(&this->nodes_);
  std::
  vector<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
  ::clear(&this->edges_);
  std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::clear
            (&this->rank_to_node_);
  std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::clear(&this->consensus_);
  return;
}

Assistant:

void Graph::Clear() {
  num_codes_ = 0;
  std::fill(coder_.begin(), coder_.end(), -1);
  std::fill(decoder_.begin(), decoder_.end(), -1);
  sequences_.clear();
  nodes_.clear();
  edges_.clear();
  rank_to_node_.clear();
  consensus_.clear();
}